

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

void opengv::printBearingVectorArraysMatlab
               (bearingVectors_t *bearingVectors1,bearingVectors_t *bearingVectors2)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  
  lVar1 = ((long)(bearingVectors1->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(bearingVectors1->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  std::operator<<((ostream *)&std::cout,"ov1 = [");
  lVar3 = 0;
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors1->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar3));
    std::operator<<(poVar2," ");
    lVar3 = lVar3 + 0x18;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,";");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar1 = 8; lVar1 != 200; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors1->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar1));
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,";");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar1 = 0x10; lVar1 != 0xd0; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors1->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar1));
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"];");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"ov2 = [");
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors2->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar1));
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,";");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar1 = 8; lVar1 != 200; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors2->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar1));
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,";");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar1 = 0x10; lVar1 != 0xd0; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors2->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar1));
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"];");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
opengv::printBearingVectorArraysMatlab(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2 )
{
  size_t numberBearingVectors = bearingVectors1.size();

  //temp: print the vectors in matlab format (for debugging purposes)
  size_t precision = 10;
  std::cout << "ov1 = [";
  for( size_t i = 0; i < numberBearingVectors; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](0,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](1,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](2,0) << " ";
  std::cout << "];" << std::endl;
  std::cout << "ov2 = [";
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](0,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](1,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](2,0) << " ";
  std::cout << "];" << std::endl;
}